

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void RegexTree::generate_followpos(StateMap *mp,FollowPos *fp,tree_node *ptr)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  reference pptVar3;
  mapped_type *pmVar4;
  reference this;
  tree_node *local_e0;
  tree_node *q;
  iterator __end3;
  iterator __begin3;
  StateSet *__range3;
  tree_node *p;
  iterator __end2;
  iterator __begin2;
  StateSet *__range2;
  undefined1 local_90 [8];
  StateSet c2;
  StateSet c1;
  tree_node *ptr_local;
  FollowPos *fp_local;
  StateMap *mp_local;
  
  bVar2 = no_child(ptr);
  if (!bVar2) {
    if (ptr->left != (tree_node *)0x0) {
      generate_followpos(mp,fp,ptr->left);
    }
    if (ptr->right != (tree_node *)0x0) {
      generate_followpos(mp,fp,ptr->right);
    }
    if ((ptr->c == '\b') || (ptr->c == '\t')) {
      pp_Var1 = &c2._M_h._M_single_bucket;
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                       *)pp_Var1);
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                       *)local_90);
      lastpos(ptr->left,(StateSet *)pp_Var1);
      if (ptr->c == '\b') {
        firstpos(ptr->right,(StateSet *)local_90);
      }
      else {
        firstpos(ptr->left,(StateSet *)local_90);
      }
      pp_Var1 = &c2._M_h._M_single_bucket;
      __end2 = std::
               unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
               ::begin((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                        *)pp_Var1);
      p = (tree_node *)
          std::
          unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
          ::end((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                 *)pp_Var1);
      while (bVar2 = std::__detail::operator!=
                               (&__end2.super__Node_iterator_base<const_tree_node_*,_false>,
                                (_Node_iterator_base<const_tree_node_*,_false> *)&p), bVar2) {
        pptVar3 = std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator*(&__end2);
        __range3 = (StateSet *)*pptVar3;
        __end3 = std::
                 unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                 ::begin((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                          *)local_90);
        q = (tree_node *)
            std::
            unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
            ::end((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                   *)local_90);
        while (bVar2 = std::__detail::operator!=
                                 (&__end3.super__Node_iterator_base<const_tree_node_*,_false>,
                                  (_Node_iterator_base<const_tree_node_*,_false> *)&q), bVar2) {
          pptVar3 = std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator*
                              (&__end3);
          local_e0 = *pptVar3;
          pmVar4 = std::
                   unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                   ::at(mp,(key_type *)&__range3);
          this = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](fp,(long)*pmVar4);
          pmVar4 = std::
                   unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                   ::at(mp,&local_e0);
          std::vector<int,_std::allocator<int>_>::push_back(this,pmVar4);
          std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator++(&__end3);
        }
        std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator++(&__end2);
      }
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::~unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                        *)local_90);
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::~unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                        *)&c2._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void RegexTree::generate_followpos(const RegexTree::StateMap &mp,
                                   RegexTree::FollowPos &fp, const tree_node *ptr) {
    if (no_child(ptr)) return;
    if (ptr->left != nullptr)
        generate_followpos(mp, fp, ptr->left);
    if (ptr->right != nullptr)
        generate_followpos(mp, fp, ptr->right);
    if (ptr->c == CAT || ptr->c == STAR) {
        StateSet c1, c2;
        lastpos(ptr->left, c1);
        if (ptr->c == CAT)
            firstpos(ptr->right, c2);
        else
            firstpos(ptr->left, c2);
        for (const tree_node *p : c1) {
            for (const tree_node *q : c2)
                fp[mp.at(p)].push_back(mp.at(q));
        }
    }
}